

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gamefield.c
# Opt level: O0

void ClearGamefield(Gamefield *gamefield)

{
  size_t x;
  size_t y;
  Gamefield *gamefield_local;
  
  for (y = 0; y < gamefield->height; y = y + 1) {
    for (x = 0; x < gamefield->width; x = x + 1) {
      gamefield->pixels[y * gamefield->width + x].lastUpdatedFrameNumber = '\0';
      gamefield->pixels[y * gamefield->width + x].pixelType = Empty;
      gamefield->pixels[y * gamefield->width + x].color.r = '\0';
      gamefield->pixels[y * gamefield->width + x].color.g = '\0';
      gamefield->pixels[y * gamefield->width + x].color.b = '\0';
      gamefield->pixels[y * gamefield->width + x].color.a = 0xff;
    }
  }
  return;
}

Assistant:

void ClearGamefield(Gamefield *gamefield) {
    for (size_t y = 0; y < gamefield->height; y++) {
        for (size_t x = 0; x < gamefield->width; x++) {
            gamefield->pixels[y * gamefield->width + x].lastUpdatedFrameNumber = 0;
            gamefield->pixels[y * gamefield->width + x].pixelType = Empty;
            gamefield->pixels[y * gamefield->width + x].color.r = 0;
            gamefield->pixels[y * gamefield->width + x].color.g = 0;
            gamefield->pixels[y * gamefield->width + x].color.b = 0;
            gamefield->pixels[y * gamefield->width + x].color.a = 255;
        }
    }
}